

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-split-pages.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *infile;
  char *__s;
  char *whoami_00;
  int iVar1;
  exception *e;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *whoami;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  whoami = (char *)argv;
  argv_local._0_4_ = argc;
  local_20 = (char *)QUtil::getWhoami(*argv);
  if (1 < (int)argv_local) {
    iVar1 = strcmp(*(char **)(whoami + 8)," --static-id");
    if (iVar1 == 0) {
      static_id = true;
      argv_local._0_4_ = (int)argv_local + -1;
      whoami = whoami + 8;
    }
  }
  if ((int)argv_local != 3) {
    usage(local_20);
  }
  whoami_00 = local_20;
  infile = *(char **)(whoami + 8);
  __s = *(char **)(whoami + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  process(whoami_00,infile,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    char const* whoami = QUtil::getWhoami(argv[0]);

    // For test suite
    if ((argc > 1) && (strcmp(argv[1], " --static-id") == 0)) {
        static_id = true;
        --argc;
        ++argv;
    }

    if (argc != 3) {
        usage(whoami);
    }
    try {
        process(whoami, argv[1], argv[2]);
    } catch (std::exception const& e) {
        std::cerr << whoami << ": exception: " << e.what() << std::endl;
        return 2;
    }
    return 0;
}